

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>::Resize
          (TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_> *this,int64_t newsize,
          TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *object)

{
  ulong uVar1;
  TPZReference *pTVar2;
  int64_t *piVar3;
  undefined8 *puVar4;
  ulong uVar5;
  long lVar6;
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *pTVar7;
  long lVar8;
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *pTVar9;
  long lVar10;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  if (this->fNElements != newsize) {
    if (newsize == 0) {
      pTVar7 = (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)0x0;
    }
    else {
      uVar1 = newsize * 8;
      uVar5 = 0xffffffffffffffff;
      if (uVar1 < 0xfffffffffffffff8) {
        uVar5 = uVar1 + 8;
      }
      lVar8 = 0;
      piVar3 = (int64_t *)operator_new__(-(ulong)((ulong)newsize >> 0x3d != 0) | uVar5);
      *piVar3 = newsize;
      pTVar7 = (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)(piVar3 + 1);
      do {
        puVar4 = (undefined8 *)operator_new(0x10);
        *puVar4 = 0;
        *(undefined4 *)(puVar4 + 1) = 0;
        LOCK();
        *(undefined4 *)(puVar4 + 1) = 1;
        UNLOCK();
        *(undefined8 **)((long)piVar3 + lVar8 + 8) = puVar4;
        lVar8 = lVar8 + 8;
      } while (uVar1 - lVar8 != 0);
    }
    lVar8 = this->fNElements;
    if (newsize <= this->fNElements) {
      lVar8 = newsize;
    }
    if (lVar8 < 1) {
      lVar6 = 0;
    }
    else {
      lVar10 = 0;
      lVar6 = 0;
      do {
        TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::operator=
                  ((TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                   ((long)&pTVar7->fRef + lVar10),
                   (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                   ((long)&this->fStore->fRef + lVar10));
        lVar6 = lVar6 + 1;
        lVar10 = lVar10 + 8;
      } while (lVar8 != lVar6);
    }
    lVar8 = newsize - lVar6;
    if (lVar8 != 0 && lVar6 <= newsize) {
      pTVar9 = pTVar7 + lVar6;
      do {
        TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::operator=(pTVar9,object);
        pTVar9 = pTVar9 + 1;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    pTVar9 = this->fStore;
    if (pTVar9 != (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)0x0) {
      pTVar2 = pTVar9[-1].fRef;
      if (pTVar2 != (TPZReference *)0x0) {
        lVar8 = (long)pTVar2 * 8;
        do {
          TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::~TPZAutoPointer
                    ((TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                     ((long)&pTVar9[-1].fRef + lVar8));
          lVar8 = lVar8 + -8;
        } while (lVar8 != 0);
      }
      operator_delete__(pTVar9 + -1,(long)pTVar2 * 8 + 8);
      this->fStore = (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)0x0;
    }
    this->fStore = pTVar7;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}